

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O1

bool __thiscall cmGeneratorTarget::HaveBuildTreeRPATH(cmGeneratorTarget *this,string *config)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  bool bVar2;
  char *pcVar3;
  cmLinkImplementationLibraries *pcVar4;
  string local_48;
  
  paVar1 = &local_48.field_2;
  local_48._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_48,"SKIP_BUILD_RPATH","");
  bVar2 = cmTarget::GetPropertyAsBool(this->Target,&local_48);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != paVar1) {
    operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
  }
  if (!bVar2) {
    local_48._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_48,"BUILD_RPATH","");
    pcVar3 = GetProperty(this,&local_48);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_48._M_dataplus._M_p != paVar1) {
      operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
    }
    if (pcVar3 != (char *)0x0) {
      return true;
    }
    pcVar4 = GetLinkImplementationLibrariesInternal(this,config,this);
    if (pcVar4 != (cmLinkImplementationLibraries *)0x0) {
      return (pcVar4->Libraries).super__Vector_base<cmLinkImplItem,_std::allocator<cmLinkImplItem>_>
             ._M_impl.super__Vector_impl_data._M_start !=
             (pcVar4->Libraries).super__Vector_base<cmLinkImplItem,_std::allocator<cmLinkImplItem>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    }
  }
  return false;
}

Assistant:

bool cmGeneratorTarget::HaveBuildTreeRPATH(const std::string& config) const
{
  if (this->GetPropertyAsBool("SKIP_BUILD_RPATH")) {
    return false;
  }
  if (this->GetProperty("BUILD_RPATH")) {
    return true;
  }
  if (cmLinkImplementationLibraries const* impl =
        this->GetLinkImplementationLibraries(config)) {
    return !impl->Libraries.empty();
  }
  return false;
}